

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_test.cpp
# Opt level: O2

void test_parse(void)

{
  unique_ptr<argo::json,_std::default_delete<argo::json>_> j_00;
  bool bVar1;
  istream *piVar2;
  ostream *poVar3;
  char *pcVar4;
  allocator local_2c9;
  unique_ptr<argo::json,_std::default_delete<argo::json>_> j1;
  unique_ptr<argo::json,_std::default_delete<argo::json>_> j;
  string line;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> valid;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> file_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  ifstream f;
  
  std::ifstream::ifstream(&f,"test_files/general/tests.txt",_S_in);
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  while( true ) {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&f,(string *)&line);
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
    std::__cxx11::string::find_first_of((char *)&line,0x11e522);
    std::__cxx11::string::substr((ulong)&file_name,(ulong)&line);
    std::__cxx11::string::substr((ulong)&valid,(ulong)&line);
    std::operator+(&local_258,"test_files/general/",&file_name);
    argo::parser::load((parser *)&j,&local_258);
    std::__cxx11::string::~string((string *)&local_258);
    bVar1 = std::operator==(&valid,"valid");
    j_00 = j;
    if (bVar1) {
      std::__cxx11::string::string((string *)&local_258,"test_files/tmp.json",(allocator *)&j1);
      argo::unparser::save
                ((json *)j_00._M_t.
                         super___uniq_ptr_impl<argo::json,_std::default_delete<argo::json>_>._M_t.
                         super__Tuple_impl<0UL,_argo::json_*,_std::default_delete<argo::json>_>.
                         super__Head_base<0UL,_argo::json_*,_false>._M_head_impl,&local_258," ","",
                 " ",0);
      std::__cxx11::string::~string((string *)&local_258);
      std::__cxx11::string::string((string *)&local_258,"test_files/tmp.json",&local_2c9);
      argo::parser::load((parser *)&j1,&local_258);
      std::__cxx11::string::~string((string *)&local_258);
      bVar1 = argo::json::operator==
                        ((json *)j1._M_t.
                                 super___uniq_ptr_impl<argo::json,_std::default_delete<argo::json>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_argo::json_*,_std::default_delete<argo::json>_>
                                 .super__Head_base<0UL,_argo::json_*,_false>._M_head_impl,
                         (json *)j._M_t.
                                 super___uniq_ptr_impl<argo::json,_std::default_delete<argo::json>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_argo::json_*,_std::default_delete<argo::json>_>
                                 .super__Head_base<0UL,_argo::json_*,_false>._M_head_impl);
      if (bVar1) {
        poVar3 = std::operator<<((ostream *)jlog,"PASS: parse test passed, valid file ");
        poVar3 = std::operator<<(poVar3,(string *)&file_name);
        pcVar4 = " was read, written, reread and compared\n";
      }
      else {
        poVar3 = std::operator<<((ostream *)jlog,"FAIL: parse test failed, valid file ");
        poVar3 = std::operator<<(poVar3,(string *)&file_name);
        pcVar4 = " was read, written, reread and came out different\n";
      }
      std::operator<<(poVar3,pcVar4);
      std::unique_ptr<argo::json,_std::default_delete<argo::json>_>::~unique_ptr(&j1);
    }
    else {
      poVar3 = std::operator<<((ostream *)jlog,"FAIL: parse test failed, invalid file ");
      poVar3 = std::operator<<(poVar3,(string *)&file_name);
      std::operator<<(poVar3," didn\'t cause an exception\n");
    }
    std::unique_ptr<argo::json,_std::default_delete<argo::json>_>::~unique_ptr(&j);
    std::__cxx11::string::~string((string *)&valid);
    std::__cxx11::string::~string((string *)&file_name);
  }
  std::__cxx11::string::~string((string *)&line);
  std::ifstream::~ifstream(&f);
  return;
}

Assistant:

void test_parse()
{
    ifstream f("test_files/general/tests.txt");

    string line;

    while (getline(f, line))
    {
        auto x = line.find_first_of(" ");
        auto file_name = line.substr(0, x);
        auto valid = line.substr(x + 1, line.size() - x -1);

        try
        {
            auto j = parser::load("test_files/general/" + file_name);
            if (valid == "valid")
            {
                unparser::save(*j, "test_files/tmp.json");
                auto j1 = parser::load("test_files/tmp.json");
                if (*j1 == *j)
                {
                    jlog << "PASS: parse test passed, valid file " << file_name << " was read, written, reread and compared\n";
                }
                else
                {
                    jlog << "FAIL: parse test failed, valid file " << file_name << " was read, written, reread and came out different\n";
                }
            }
            else
            {
                jlog << "FAIL: parse test failed, invalid file " << file_name << " didn't cause an exception\n";
            }
        }
        catch (exception &e)
        {
            if (valid == "valid")
            {
                jlog << "FAIL: parse test failed, valid file " << file_name << " caused an exception\n";
                jlog << e.what() << endl;
            }
            else
            {
                jlog << "PASS: parse test passed, invalid file " << file_name << " caused an exception:" << e.what() << endl;
            }
        }
    }
}